

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GMAA_MAAstarCluster.cpp
# Opt level: O2

string * __thiscall
GMAA_MAAstarCluster::SoftPrintClusteringStats_abi_cxx11_
          (string *__return_storage_ptr__,GMAA_MAAstarCluster *this)

{
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  MultiAgentDecisionProcessDiscreteInterface *pMVar1;
  int *piVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  ostream *poVar6;
  undefined4 extraout_var;
  undefined8 uVar7;
  Index aI;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  int *piVar11;
  LIndex i;
  pointer pvVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 in_XMM2 [16];
  string local_508 [32];
  string local_4e8 [32];
  stringstream ss_1;
  ostream local_4b8 [376];
  stringstream ss;
  ostream local_330 [376];
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar6 = std::operator<<(local_330,"Number of joint types after clustering in each BG.");
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<(local_330,
                           "timestep compressionRatio averageAfterClustering sizeWithoutClustering <all entries>"
                          );
  std::endl<char,std::char_traits<char>>(poVar6);
  uVar9 = 0;
  while( true ) {
    pvVar12 = (this->_m_clusteredBGsizes).
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar10 = (ulong)uVar9;
    if (((long)(this->_m_clusteredBGsizes).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar12) / 0x18 == uVar10) break;
    __first._M_current =
         pvVar12[uVar10].super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start;
    __last._M_current =
         pvVar12[uVar10].super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__last._M_current != __first._M_current) {
      dVar13 = std::
               accumulate<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,double>
                         (__first,__last,0.0);
      pvVar12 = (this->_m_clusteredBGsizes).
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      auVar3 = vcvtusi2sd_avx512f(in_XMM2,(long)pvVar12[uVar10].
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_finish -
                                          *(long *)&pvVar12[uVar10].
                                                    super__Vector_base<int,_std::allocator<int>_>.
                                                    _M_impl.super__Vector_impl_data >> 2);
      dVar13 = dVar13 / auVar3._0_8_;
      auVar3 = vcvtusi2sd_avx512f(in_XMM2,uVar9);
      uVar8 = 0;
      i = 1;
      while( true ) {
        iVar5 = (*(this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
                  super_PlanningUnitDecPOMDPDiscrete.super_PlanningUnitMADPDiscrete.
                  super_PlanningUnit._vptr_PlanningUnit[6])(this);
        if (CONCAT44(extraout_var,iVar5) == (ulong)uVar8) break;
        pMVar1 = (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
                 super_PlanningUnitDecPOMDPDiscrete.super_PlanningUnitMADPDiscrete._m_madp;
        uVar7 = (**(code **)((long)*pMVar1 + 0xc0))(pMVar1,uVar8);
        auVar4 = vcvtusi2sd_avx512f(in_XMM2,uVar7);
        dVar14 = pow(auVar4._0_8_,auVar3._0_8_);
        auVar4 = vcvtusi2sd_avx512f(in_XMM2,i);
        uVar8 = uVar8 + 1;
        auVar15._8_8_ = 0;
        auVar15._0_8_ = dVar14 * auVar4._0_8_;
        i = vcvttsd2usi_avx512f(auVar15);
      }
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)local_330);
      std::operator<<(poVar6," ");
      dVar14 = Globals::CastLIndexToDouble(i);
      poVar6 = std::ostream::_M_insert<double>(dVar14 / dVar13);
      std::operator<<(poVar6," ");
      poVar6 = std::ostream::_M_insert<double>(dVar13);
      poVar6 = std::operator<<(poVar6," ");
      poVar6 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar6);
      poVar6 = std::operator<<(poVar6," ");
      pvVar12 = (this->_m_clusteredBGsizes).
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar10;
      std::__cxx11::stringstream::stringstream((stringstream *)&ss_1);
      piVar11 = (pvVar12->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      piVar2 = (pvVar12->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      std::operator<<(local_4b8,"< ");
      for (; piVar11 != piVar2; piVar11 = piVar11 + 1) {
        if (piVar11 !=
            (pvVar12->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
            ._M_start) {
          std::operator<<(local_4b8,", ");
        }
        std::__cxx11::stringstream::stringstream(local_1b8);
        std::ostream::operator<<(local_1a8,*piVar11);
        std::__cxx11::stringbuf::str();
        std::__cxx11::stringstream::~stringstream(local_1b8);
        std::operator<<(local_4b8,local_4e8);
        std::__cxx11::string::~string(local_4e8);
      }
      std::operator<<(local_4b8," >");
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss_1);
      poVar6 = std::operator<<(poVar6,local_508);
      std::endl<char,std::char_traits<char>>(poVar6);
      std::__cxx11::string::~string(local_508);
    }
    uVar9 = uVar9 + 1;
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

std::string GMAA_MAAstarCluster::SoftPrintClusteringStats() const
{
    stringstream ss;

    ss << "Number of joint types after clustering in each BG." << endl;
    ss << "timestep compressionRatio averageAfterClustering sizeWithoutClustering <all entries>" << endl;

#if 0
    ss << "CBGsize";
    for(unsigned int i=0;i!=_m_clusteredBGsizes.size();++i)
    {
        double average=accumulate(_m_clusteredBGsizes[i].begin(),
                                  _m_clusteredBGsizes[i].end(),0.0) /
            _m_clusteredBGsizes[i].size();
        if(_m_clusteredBGsizes[i].size()>0)
            ss << " " << average;
    }
    ss << endl;

    ss << "CBGratio";
#endif

    for(unsigned int i=0;i!=_m_clusteredBGsizes.size();++i)
    {
        if(_m_clusteredBGsizes[i].size()>0)
        {
            double average=accumulate(_m_clusteredBGsizes[i].begin(),
                                      _m_clusteredBGsizes[i].end(),0.0) /
                _m_clusteredBGsizes[i].size();

            LIndex originalBGsize=1;
            for(Index aI=0;aI!=GetNrAgents();++aI)
                originalBGsize*=pow(//pow needs correct arguments, otherwise I get 
                    //call of overloaded 'pow(size_t, unsigned int&)' is ambiguous
                    ((double)GetNrObservations(aI)),
                    ((double)i));
            
#if 1
            ss << i
               << " " << CastLIndexToDouble(originalBGsize)/average
               << " " << average
               << " " << originalBGsize
               << " " << SoftPrintVector(_m_clusteredBGsizes[i]) << endl;
#else
            ss << " " << static_cast<double>(originalBGsize)/average;
#endif
        }
    }
    return(ss.str());
}